

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForceMatrixDecomposition.cpp
# Opt level: O0

int __thiscall
OpenMD::ForceMatrixDecomposition::getTopologicalDistance
          (ForceMatrixDecomposition *this,int atom1,int atom2)

{
  reference pvVar1;
  size_type sVar2;
  reference pvVar3;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  uint j;
  uint local_1c;
  
  local_1c = 0;
  while( true ) {
    pvVar1 = std::
             vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           *)(in_RDI + 0x1e0),(long)in_ESI);
    sVar2 = std::vector<int,_std::allocator<int>_>::size(pvVar1);
    if (sVar2 <= local_1c) {
      return 0;
    }
    pvVar1 = std::
             vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           *)(in_RDI + 0x1e0),(long)in_ESI);
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](pvVar1,(ulong)local_1c);
    if (*pvVar3 == in_EDX) break;
    local_1c = local_1c + 1;
  }
  pvVar1 = std::
           vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         *)(in_RDI + 0x1f8),(long)in_ESI);
  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](pvVar1,(ulong)local_1c);
  return *pvVar3;
}

Assistant:

int ForceMatrixDecomposition::getTopologicalDistance(int atom1, int atom2) {
    for (unsigned int j = 0; j < toposForAtom[atom1].size(); j++) {
      if (toposForAtom[atom1][j] == atom2) return topoDist[atom1][j];
    }
    return 0;
  }